

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Options
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,RegexFlags *flags)

{
  StandardChars<char16_t> *pSVar1;
  bool bVar2;
  EncodedChar EVar3;
  EncodedChar EVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ScriptConfiguration *pSVar9;
  Char local_22;
  uint32 n;
  Char c;
  CharCount consume;
  EncodedChar ec;
  RegexFlags *flags_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  do {
    EVar3 = ECLookahead(this,0);
    if (EVar3 == L'\0') {
      return;
    }
    if (((EVar3 == L'\\') && (bVar2 = ECCanConsume(this,6), bVar2)) &&
       (EVar4 = ECLookahead(this,1), EVar4 == L'u')) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,2);
      bVar2 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
      if (!bVar2) goto LAB_0159c356;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,3);
      bVar2 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
      if (!bVar2) goto LAB_0159c356;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,4);
      bVar2 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
      if (!bVar2) goto LAB_0159c356;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,5);
      bVar2 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
      if (!bVar2) goto LAB_0159c356;
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar9);
      if (bVar2) {
        Fail(this,-0x7ff5ec67);
        return;
      }
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,2);
      uVar5 = StandardChars<char16_t>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,3);
      uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,4);
      uVar7 = StandardChars<char16_t>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,5);
      uVar8 = StandardChars<char16_t>::DigitValue(pSVar1,EVar3);
      local_22 = Chars<char16_t>::UTC(uVar5 << 0xc | uVar6 << 8 | uVar7 << 4 | uVar8);
      n = 6;
    }
    else {
LAB_0159c356:
      local_22 = Chars<char16_t>::CTW(EVar3);
      n = 1;
    }
    switch(local_22) {
    case L'g':
      if ((*flags & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | GlobalRegexFlag;
      break;
    default:
      goto switchD_0159c39a_caseD_68;
    case L'i':
      if ((*flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | IgnoreCaseRegexFlag;
      break;
    case L'm':
      if ((*flags & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | MultilineRegexFlag;
      break;
    case L's':
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar9);
      if (!bVar2) goto switchD_0159c39a_caseD_75;
      if ((*flags & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | DotAllRegexFlag;
      break;
    case L'u':
switchD_0159c39a_caseD_75:
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar9);
      if (!bVar2) goto switchD_0159c39a_caseD_79;
      if ((*flags & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | UnicodeRegexFlag;
      break;
    case L'y':
switchD_0159c39a_caseD_79:
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES6RegExStickyEnabled(pSVar9);
      if (!bVar2) {
switchD_0159c39a_caseD_68:
        bVar2 = StandardChars<char16_t>::IsWord(this->standardChars,local_22);
        if (!bVar2) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      if ((*flags & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | StickyRegexFlag;
    }
    ECConsume(this,n);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }